

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

int __thiscall hwnet::util::Timer::cancel(Timer *this)

{
  id __x;
  bool bVar1;
  __int_type_conflict2 _Var2;
  atomic_uint *paVar3;
  undefined1 local_e0 [8];
  shared_ptr<hwnet::util::Timer> s;
  uint setv2;
  uint setv1;
  uint expected2;
  uint expected1;
  Timer *this_local;
  undefined4 local_a0;
  undefined4 local_9c;
  uint *local_98;
  atomic_uint *local_90;
  undefined4 local_88;
  undefined4 local_84;
  uint *local_80;
  atomic_uint *local_78;
  uint local_6c;
  memory_order local_68;
  int local_64;
  memory_order __b;
  bool local_51;
  undefined4 local_50;
  memory_order local_4c;
  undefined4 local_48;
  undefined4 local_44;
  uint *local_40;
  atomic_uint *local_38;
  bool local_29;
  undefined4 local_28;
  memory_order local_24;
  undefined4 local_20;
  undefined4 local_1c;
  uint *local_18;
  atomic_uint *local_10;
  
  setv1 = 0;
  setv2 = 4;
  paVar3 = &this->mStatus;
  local_84 = 2;
  local_88 = 5;
  _expected2 = this;
  local_80 = &setv1;
  local_78 = paVar3;
  local_4c = std::__cmpexch_failure_order(memory_order_seq_cst);
  local_44 = 2;
  local_48 = 5;
  local_50 = 2;
  switch(0x1617ee) {
  default:
    if (local_4c - memory_order_consume < 2) {
      LOCK();
      _Var2 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
      local_51 = setv1 == _Var2;
      if (local_51) {
        (paVar3->super___atomic_base<unsigned_int>)._M_i = 2;
        _Var2 = setv1;
      }
      UNLOCK();
      if (!local_51) {
        setv1 = _Var2;
      }
    }
    else if (local_4c == memory_order_seq_cst) {
      LOCK();
      _Var2 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
      local_51 = setv1 == _Var2;
      if (local_51) {
        (paVar3->super___atomic_base<unsigned_int>)._M_i = 2;
        _Var2 = setv1;
      }
      UNLOCK();
      if (!local_51) {
        setv1 = _Var2;
      }
    }
    else {
      LOCK();
      _Var2 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
      local_51 = setv1 == _Var2;
      if (local_51) {
        (paVar3->super___atomic_base<unsigned_int>)._M_i = 2;
        _Var2 = setv1;
      }
      UNLOCK();
      if (!local_51) {
        setv1 = _Var2;
      }
    }
    break;
  case 2:
    if (local_4c - memory_order_consume < 2) {
      LOCK();
      _Var2 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
      local_51 = setv1 == _Var2;
      if (local_51) {
        (paVar3->super___atomic_base<unsigned_int>)._M_i = 2;
        _Var2 = setv1;
      }
      UNLOCK();
      if (!local_51) {
        setv1 = _Var2;
      }
    }
    else if (local_4c == memory_order_seq_cst) {
      LOCK();
      _Var2 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
      local_51 = setv1 == _Var2;
      if (local_51) {
        (paVar3->super___atomic_base<unsigned_int>)._M_i = 2;
        _Var2 = setv1;
      }
      UNLOCK();
      if (!local_51) {
        setv1 = _Var2;
      }
    }
    else {
      LOCK();
      _Var2 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
      local_51 = setv1 == _Var2;
      if (local_51) {
        (paVar3->super___atomic_base<unsigned_int>)._M_i = 2;
        _Var2 = setv1;
      }
      UNLOCK();
      if (!local_51) {
        setv1 = _Var2;
      }
    }
    break;
  case 3:
    if (local_4c - memory_order_consume < 2) {
      LOCK();
      _Var2 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
      local_51 = setv1 == _Var2;
      if (local_51) {
        (paVar3->super___atomic_base<unsigned_int>)._M_i = 2;
        _Var2 = setv1;
      }
      UNLOCK();
      if (!local_51) {
        setv1 = _Var2;
      }
    }
    else if (local_4c == memory_order_seq_cst) {
      LOCK();
      _Var2 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
      local_51 = setv1 == _Var2;
      if (local_51) {
        (paVar3->super___atomic_base<unsigned_int>)._M_i = 2;
        _Var2 = setv1;
      }
      UNLOCK();
      if (!local_51) {
        setv1 = _Var2;
      }
    }
    else {
      LOCK();
      _Var2 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
      local_51 = setv1 == _Var2;
      if (local_51) {
        (paVar3->super___atomic_base<unsigned_int>)._M_i = 2;
        _Var2 = setv1;
      }
      UNLOCK();
      if (!local_51) {
        setv1 = _Var2;
      }
    }
    break;
  case 4:
    if (local_4c - memory_order_consume < 2) {
      LOCK();
      _Var2 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
      local_51 = setv1 == _Var2;
      if (local_51) {
        (paVar3->super___atomic_base<unsigned_int>)._M_i = 2;
        _Var2 = setv1;
      }
      UNLOCK();
      if (!local_51) {
        setv1 = _Var2;
      }
    }
    else if (local_4c == memory_order_seq_cst) {
      LOCK();
      _Var2 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
      local_51 = setv1 == _Var2;
      if (local_51) {
        (paVar3->super___atomic_base<unsigned_int>)._M_i = 2;
        _Var2 = setv1;
      }
      UNLOCK();
      if (!local_51) {
        setv1 = _Var2;
      }
    }
    else {
      LOCK();
      _Var2 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
      local_51 = setv1 == _Var2;
      if (local_51) {
        (paVar3->super___atomic_base<unsigned_int>)._M_i = 2;
        _Var2 = setv1;
      }
      UNLOCK();
      if (!local_51) {
        setv1 = _Var2;
      }
    }
  }
  local_40 = &setv1;
  local_38 = paVar3;
  if (local_51 == false) {
    paVar3 = &this->mStatus;
    local_9c = 6;
    local_a0 = 5;
    local_98 = &setv2;
    local_90 = paVar3;
    local_24 = std::__cmpexch_failure_order(memory_order_seq_cst);
    local_1c = 6;
    local_20 = 5;
    local_28 = 6;
    switch(0x161e10) {
    default:
      if (local_24 - memory_order_consume < 2) {
        LOCK();
        _Var2 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
        local_29 = setv2 == _Var2;
        if (local_29) {
          (paVar3->super___atomic_base<unsigned_int>)._M_i = 6;
          _Var2 = setv2;
        }
        UNLOCK();
        if (!local_29) {
          setv2 = _Var2;
        }
      }
      else if (local_24 == memory_order_seq_cst) {
        LOCK();
        _Var2 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
        local_29 = setv2 == _Var2;
        if (local_29) {
          (paVar3->super___atomic_base<unsigned_int>)._M_i = 6;
          _Var2 = setv2;
        }
        UNLOCK();
        if (!local_29) {
          setv2 = _Var2;
        }
      }
      else {
        LOCK();
        _Var2 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
        local_29 = setv2 == _Var2;
        if (local_29) {
          (paVar3->super___atomic_base<unsigned_int>)._M_i = 6;
          _Var2 = setv2;
        }
        UNLOCK();
        if (!local_29) {
          setv2 = _Var2;
        }
      }
      break;
    case 2:
      if (local_24 - memory_order_consume < 2) {
        LOCK();
        _Var2 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
        local_29 = setv2 == _Var2;
        if (local_29) {
          (paVar3->super___atomic_base<unsigned_int>)._M_i = 6;
          _Var2 = setv2;
        }
        UNLOCK();
        if (!local_29) {
          setv2 = _Var2;
        }
      }
      else if (local_24 == memory_order_seq_cst) {
        LOCK();
        _Var2 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
        local_29 = setv2 == _Var2;
        if (local_29) {
          (paVar3->super___atomic_base<unsigned_int>)._M_i = 6;
          _Var2 = setv2;
        }
        UNLOCK();
        if (!local_29) {
          setv2 = _Var2;
        }
      }
      else {
        LOCK();
        _Var2 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
        local_29 = setv2 == _Var2;
        if (local_29) {
          (paVar3->super___atomic_base<unsigned_int>)._M_i = 6;
          _Var2 = setv2;
        }
        UNLOCK();
        if (!local_29) {
          setv2 = _Var2;
        }
      }
      break;
    case 3:
      if (local_24 - memory_order_consume < 2) {
        LOCK();
        _Var2 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
        local_29 = setv2 == _Var2;
        if (local_29) {
          (paVar3->super___atomic_base<unsigned_int>)._M_i = 6;
          _Var2 = setv2;
        }
        UNLOCK();
        if (!local_29) {
          setv2 = _Var2;
        }
      }
      else if (local_24 == memory_order_seq_cst) {
        LOCK();
        _Var2 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
        local_29 = setv2 == _Var2;
        if (local_29) {
          (paVar3->super___atomic_base<unsigned_int>)._M_i = 6;
          _Var2 = setv2;
        }
        UNLOCK();
        if (!local_29) {
          setv2 = _Var2;
        }
      }
      else {
        LOCK();
        _Var2 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
        local_29 = setv2 == _Var2;
        if (local_29) {
          (paVar3->super___atomic_base<unsigned_int>)._M_i = 6;
          _Var2 = setv2;
        }
        UNLOCK();
        if (!local_29) {
          setv2 = _Var2;
        }
      }
      break;
    case 4:
      if (local_24 - memory_order_consume < 2) {
        LOCK();
        _Var2 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
        local_29 = setv2 == _Var2;
        if (local_29) {
          (paVar3->super___atomic_base<unsigned_int>)._M_i = 6;
          _Var2 = setv2;
        }
        UNLOCK();
        if (!local_29) {
          setv2 = _Var2;
        }
      }
      else if (local_24 == memory_order_seq_cst) {
        LOCK();
        _Var2 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
        local_29 = setv2 == _Var2;
        if (local_29) {
          (paVar3->super___atomic_base<unsigned_int>)._M_i = 6;
          _Var2 = setv2;
        }
        UNLOCK();
        if (!local_29) {
          setv2 = _Var2;
        }
      }
      else {
        LOCK();
        _Var2 = (paVar3->super___atomic_base<unsigned_int>)._M_i;
        local_29 = setv2 == _Var2;
        if (local_29) {
          (paVar3->super___atomic_base<unsigned_int>)._M_i = 6;
          _Var2 = setv2;
        }
        UNLOCK();
        if (!local_29) {
          setv2 = _Var2;
        }
      }
    }
    local_18 = &setv2;
    local_10 = paVar3;
    if (local_29 == false) {
      return 3;
    }
  }
  paVar3 = &this->mStatus;
  local_64 = 5;
  ___b = paVar3;
  local_68 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  if (local_64 - 1U < 2) {
    local_6c = (paVar3->super___atomic_base<unsigned_int>)._M_i;
  }
  else if (local_64 == 5) {
    local_6c = (paVar3->super___atomic_base<unsigned_int>)._M_i;
  }
  else {
    local_6c = (paVar3->super___atomic_base<unsigned_int>)._M_i;
  }
  if ((local_6c & 4) == 0) {
    std::enable_shared_from_this<hwnet::util::Timer>::shared_from_this
              ((enable_shared_from_this<hwnet::util::Timer> *)local_e0);
    TimerMgr::remove(this->mMgr,(char *)local_e0);
    this_local._4_4_ = 0;
    std::shared_ptr<hwnet::util::Timer>::~shared_ptr((shared_ptr<hwnet::util::Timer> *)local_e0);
  }
  else {
    __x._M_thread = (this->tid)._M_thread;
    s.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)std::this_thread::get_id();
    bVar1 = std::operator==(__x,(id)s.
                                    super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi);
    if (bVar1) {
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = 2;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Timer::cancel() {

	uint expected1 = 0;
	uint expected2 = Timer::incallback;
	uint setv1 = Timer::canceled;
	uint setv2 = Timer::incallback | Timer::canceled;
	if(mStatus.compare_exchange_strong(expected1,setv1) || mStatus.compare_exchange_strong(expected2,setv2)) {
		if(mStatus.load() & Timer::incallback) {
			if(this->tid == std::this_thread::get_id()) {
				//在回调函数调用栈内,定时器不会再被执行
				return Timer::doing_callback_in_current_thread;
			} else {
				//定时器正在当前线程不同的线程中执行回调，定时器不会再被执行
				return Timer::doing_callback_in_other_thread;
			}
		} else {
			auto s = shared_from_this();
			mMgr->remove(s);
			return Timer::cancel_ok;
		}
	} else {
		return Timer::invaild_timer;
	} 
}